

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O0

bool __thiscall CETestSuite::test(CETestSuite *this,bool test_success,string *function,int *line)

{
  byte in_SIL;
  string *in_RDI;
  int *in_stack_ffffffffffffff68;
  allocator *line_00;
  string *in_stack_ffffffffffffff70;
  string *function_00;
  CETestSuite *in_stack_ffffffffffffff80;
  string local_78 [55];
  undefined1 local_41 [56];
  byte local_9 [9];
  
  local_9[0] = in_SIL & 1;
  if (local_9[0] == 0) {
    line_00 = (allocator *)&stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Generic test FAILED.",line_00);
    log_failure(in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70,(int *)line_00);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  }
  else {
    function_00 = (string *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_41 + 1),"Generic test SUCCEEDED.",(allocator *)function_00);
    log_success(in_stack_ffffffffffffff80,in_RDI,function_00,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
  }
  (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,local_9);
  return (bool)(local_9[0] & 1);
}

Assistant:

bool CETestSuite::test(bool  test_success, 
                       const std::string& function,
                       const int&         line)
{
    // Values equal within tolerance
    if (test_success) {
        log_success("Generic test SUCCEEDED.", function, line);
    } 
    // Values not within tolerance
    else {
        log_failure("Generic test FAILED.", function, line);
    }

    update_pass(test_success);
    return test_success;
}